

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall fmt::v6::internal::bigint::subtract_aligned(bigint *this,bigint *other)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  uVar8 = (ulong)(uint)(other->bigits_).super_buffer<unsigned_int>.size_;
  iVar5 = other->exp_ - this->exp_;
  if (uVar8 == 0) {
    uVar6 = 0;
  }
  else {
    puVar1 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar7 = 0;
    lVar9 = 0;
    do {
      uVar6 = (ulong)puVar2[(long)iVar5 + uVar7] + (lVar9 - (ulong)puVar1[uVar7]);
      puVar2[(long)iVar5 + uVar7] = (uint)uVar6;
      lVar9 = (long)uVar6 >> 0x3f;
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
    uVar6 = uVar6 >> 0x3f;
    iVar5 = iVar5 + (int)uVar7;
  }
  if ((int)uVar6 != 0) {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar8 = (ulong)puVar1[iVar5];
    do {
      uVar8 = (uVar8 & 0xffffffff) - uVar6;
      uVar6 = uVar8 >> 0x3f;
    } while ((long)uVar8 < 0);
    puVar1[iVar5] = (uint)uVar8;
    remove_leading_zeros(this);
    return;
  }
  uVar8 = (this->bigits_).super_buffer<unsigned_int>.size_;
  iVar3 = (int)uVar8;
  uVar8 = uVar8 & 0xffffffff;
  iVar5 = 1;
  if (iVar3 < 1) {
    iVar5 = iVar3;
  }
  iVar3 = iVar3 + 1;
  do {
    iVar4 = iVar5;
    if ((int)uVar8 < 2) break;
    iVar3 = iVar3 + -1;
    lVar9 = uVar8 - 1;
    uVar8 = uVar8 - 1;
    iVar4 = iVar3;
  } while ((this->bigits_).super_buffer<unsigned_int>.ptr_[lVar9] == 0);
  uVar8 = (ulong)iVar4;
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar8) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar8);
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar8;
  return;
}

Assistant:

std::size_t size() const FMT_NOEXCEPT { return size_; }